

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O3

t_int * sigsamphold_perform(t_int *w)

{
  long lVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  
  lVar1 = w[4];
  tVar2 = w[5];
  fVar9 = *(float *)(lVar1 + 0x34);
  uVar7 = *(undefined4 *)(lVar1 + 0x38);
  if (0 < (int)tVar2) {
    lVar3 = w[3];
    lVar4 = w[1];
    lVar5 = w[2];
    lVar6 = 0;
    fVar8 = fVar9;
    do {
      fVar9 = *(float *)(lVar5 + lVar6 * 4);
      if (fVar9 < fVar8) {
        uVar7 = *(undefined4 *)(lVar4 + lVar6 * 4);
      }
      *(undefined4 *)(lVar3 + lVar6 * 4) = uVar7;
      lVar6 = lVar6 + 1;
      fVar8 = fVar9;
    } while ((int)tVar2 != (int)lVar6);
  }
  *(float *)(lVar1 + 0x34) = fVar9;
  *(undefined4 *)(lVar1 + 0x38) = uVar7;
  return w + 6;
}

Assistant:

static t_int *sigsamphold_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigsamphold *x = (t_sigsamphold *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample lastin = x->x_lastin;
    t_sample lastout = x->x_lastout;
    for (i = 0; i < n; i++, in1++)
    {
        t_sample next = *in2++;
        if (next < lastin) lastout = *in1;
        *out++ = lastout;
        lastin = next;
    }
    x->x_lastin = lastin;
    x->x_lastout = lastout;
    return (w+6);
}